

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

void __thiscall t_php_generator::generate_service_helpers(t_php_generator *this,t_service *tservice)

{
  string *__lhs;
  ofstream_with_content_based_conditional_update *this_00;
  t_struct *tstruct;
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  int __oflag;
  pointer pptVar3;
  ofstream_with_content_based_conditional_update *poVar4;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string f_struct_definition_name;
  string name;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_e8,&tservice->functions_)
  ;
  this_00 = &this->f_service_;
  if (this->classmap_ == true) {
    poVar2 = std::operator<<((ostream *)this_00,"// HELPER FUNCTIONS AND STRUCTURES");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  __lhs = &(this->super_t_oop_generator).super_t_generator.service_name_;
  for (pptVar3 = local_e8._M_impl.super__Vector_impl_data._M_start;
      pptVar3 != local_e8._M_impl.super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    tstruct = (*pptVar3)->arglist_;
    iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    std::__cxx11::string::string((string *)&local_b0,(string *)CONCAT44(extraout_var,iVar1));
    std::operator+(&local_90,__lhs,"_");
    std::operator+(&local_d0,&local_90,&local_b0);
    (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[2])(tstruct,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    if (this->classmap_ == false) {
      std::operator+(&local_70,&this->package_dir_,__lhs);
      std::operator+(&local_50,&local_70,"_");
      std::operator+(&local_90,&local_50,&local_b0);
      std::operator+(&local_d0,&local_90,".php");
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string
                ((string *)&local_90,local_d0._M_dataplus._M_p,(allocator *)&local_50);
      template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
                (this_00,(char *)&local_90,__oflag);
      std::__cxx11::string::~string((string *)&local_90);
      generate_service_header(this,tservice,(ostream *)this_00);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    poVar4 = this_00;
    generate_php_struct_definition(this,(ostream *)this_00,tstruct,false,false);
    if (this->classmap_ == false) {
      template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
                (this_00,(int)poVar4);
    }
    generate_php_function_helpers(this,tservice,*pptVar3);
    (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[2])(tstruct,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_e8);
  return;
}

Assistant:

void t_php_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  ofstream_with_content_based_conditional_update& f_struct_definition = f_service_;
  if (classmap_) {
    f_struct_definition << "// HELPER FUNCTIONS AND STRUCTURES" << endl << endl;
  }

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* ts = (*f_iter)->get_arglist();
    string name = ts->get_name();
    ts->set_name(service_name_ + "_" + name);

    if (!classmap_) {
      string f_struct_definition_name = package_dir_ + service_name_ + "_" + name + ".php";
      f_struct_definition.open(f_struct_definition_name.c_str());
      generate_service_header(tservice, f_struct_definition);
    }

    generate_php_struct_definition(f_struct_definition, ts);
    if (!classmap_) {
      f_struct_definition.close();
    }

    generate_php_function_helpers(tservice, *f_iter);
    ts->set_name(name);
  }
}